

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

void __thiscall acto::core::event::signaled(event *this)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> g;
  event *this_local;
  
  g._M_device = &this->mutex_;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mutex_);
  this->triggered_ = true;
  std::condition_variable::notify_one();
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void event::signaled() {
  std::lock_guard g(mutex_);

  triggered_ = true;
  cond_.notify_one();
}